

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O1

void trico_compress_double_precision
               (uint32_t *nr_of_compressed_bytes,uint8_t **out,double *input,
               uint32_t number_of_doubles,uint64_t hash1_size_exponent,uint64_t hash2_size_exponent)

{
  double dVar1;
  void *pvVar2;
  void *pvVar3;
  byte *pbVar4;
  ulong uVar5;
  uint8_t *puVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t *puVar10;
  long lVar11;
  uint8_t **ppuVar12;
  double dVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  size_t __nmemb;
  ulong uVar18;
  size_t __nmemb_00;
  bool bVar19;
  uint64_t bcode [2];
  uint64_t xor2 [2];
  uint64_t xor1 [2];
  byte *local_e0;
  uint64_t local_d8 [2];
  uint32_t *local_c8;
  uint8_t **local_c0;
  ulong local_b8;
  void *local_b0;
  void *local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  ulong local_80;
  double *local_78;
  long local_70;
  long local_68;
  double local_60;
  uint64_t local_58 [5];
  ulong uVar17;
  
  uVar18 = hash1_size_exponent & 0xfffffffffffffffe;
  uVar14 = hash2_size_exponent & 0xfffffffffffffffe;
  if (0x1d < uVar18) {
    uVar18 = 0x1e;
  }
  if (0x1d < uVar14) {
    uVar14 = 0x1e;
  }
  local_c8 = nr_of_compressed_bytes;
  local_c0 = out;
  local_78 = input;
  pbVar4 = (byte *)malloc((ulong)((number_of_doubles & 1) +
                                 (number_of_doubles >> 1) + number_of_doubles * 8));
  *out = pbVar4;
  __nmemb_00 = 1L << ((byte)uVar18 & 0x3f);
  __nmemb = 1L << ((byte)uVar14 & 0x3f);
  local_a8 = calloc(__nmemb_00,8);
  local_b0 = calloc(__nmemb,8);
  local_80 = uVar14 >> 1 & 0x7fffffff;
  *pbVar4 = (byte)uVar18 * '\b' | (byte)local_80;
  pbVar4[1] = (byte)(number_of_doubles >> 0x18);
  pbVar4[2] = (byte)(number_of_doubles >> 0x10);
  pbVar4[3] = (byte)(number_of_doubles >> 8);
  local_e0 = pbVar4 + 5;
  pbVar4[4] = (byte)number_of_doubles;
  local_b8 = uVar18;
  if (number_of_doubles != 0) {
    local_a0 = __nmemb - 1;
    local_90 = 0x40 - uVar18;
    local_88 = 0x40 - uVar14;
    local_98 = (ulong)number_of_doubles;
    lVar15 = 0;
    lVar11 = 0;
    dVar13 = 0.0;
    uVar14 = 0;
    uVar18 = 0;
    local_60 = 0.0;
    do {
      pvVar3 = local_a8;
      pvVar2 = local_b0;
      uVar16 = (uint)lVar15 & 1;
      uVar17 = (ulong)uVar16;
      dVar1 = local_78[lVar15];
      *(double *)((long)local_a8 + uVar18 * 8) = dVar1;
      uVar8 = (ulong)dVar1 ^ (ulong)dVar13;
      *(long *)((long)local_b0 + uVar14 * 8) = (long)dVar1 - (long)local_60;
      uVar9 = (ulong)(uVar16 << 3);
      *(ulong *)((long)local_58 + uVar9 + 0x10) = uVar8;
      uVar18 = (uVar18 << ((byte)local_b8 & 0x3f) ^ (ulong)dVar1 >> ((byte)local_90 & 0x3f)) &
               __nmemb_00 - 1;
      uVar5 = lVar11 + (long)local_60 ^ (ulong)dVar1;
      *(ulong *)((long)local_58 + uVar9) = uVar5;
      uVar14 = (uVar14 << ((byte)local_80 & 0x3f) ^
               (ulong)((long)dVar1 - (long)local_60) >> ((byte)local_88 & 0x3f)) & local_a0;
      *(undefined8 *)((long)local_d8 + uVar9) = 8;
      lVar11 = *(long *)((long)pvVar2 + uVar14 * 8);
      bVar19 = dVar1 == dVar13;
      dVar13 = *(double *)((long)pvVar3 + uVar18 * 8);
      local_60 = dVar1;
      if (bVar19) {
        uVar7 = 0;
LAB_0010a3ab:
        local_d8[uVar17] = uVar7;
      }
      else {
        uVar7 = 1;
        if (uVar8 < 0x100) goto LAB_0010a3ab;
        if (uVar8 < 0x10000) {
          uVar7 = 2;
          if (uVar5 < 0x100) {
            uVar7 = 9;
          }
          goto LAB_0010a3ab;
        }
        if (0xffffff < uVar8) {
          if (uVar8 >> 0x20 == 0) {
            local_d8[uVar17] = 4;
            uVar7 = 9;
            if (((0xff < uVar5) && (uVar7 = 10, 0xffff < uVar5)) && (uVar7 = 0xb, 0xffffff < uVar5))
            goto LAB_0010a3b0;
          }
          else if (uVar8 >> 0x28 == 0) {
            local_d8[uVar17] = 5;
            uVar7 = 9;
            if (((0xff < uVar5) && (uVar7 = 10, 0xffff < uVar5)) &&
               ((uVar7 = 0xb, 0xffffff < uVar5 && (uVar7 = 0xc, uVar5 >> 0x20 != 0))))
            goto LAB_0010a3b0;
          }
          else if (uVar8 >> 0x30 == 0) {
            local_d8[uVar17] = 6;
            uVar7 = 9;
            if ((((0xff < uVar5) && (uVar7 = 10, 0xffff < uVar5)) && (uVar7 = 0xb, 0xffffff < uVar5)
                ) && (uVar7 = 0xc, uVar5 >> 0x20 != 0)) {
              uVar7 = 0xd;
              uVar9 = 0x10000000000;
              goto LAB_0010a563;
            }
          }
          else if (uVar8 >> 0x38 == 0) {
            local_d8[uVar17] = 7;
            uVar7 = 9;
            if (((0xff < uVar5) && (uVar7 = 10, 0xffff < uVar5)) &&
               ((uVar7 = 0xb, 0xffffff < uVar5 &&
                ((uVar7 = 0xc, uVar5 >> 0x20 != 0 && (uVar7 = 0xd, 0xffffffffff < uVar5)))))) {
              uVar7 = 0xe;
              uVar9 = 0x1000000000000;
LAB_0010a563:
              if (uVar9 <= uVar5) goto LAB_0010a3b0;
            }
          }
          else {
            uVar7 = 9;
            if (((((0xff < uVar5) && (uVar7 = 10, 0xffff < uVar5)) &&
                 (uVar7 = 0xb, 0xffffff < uVar5)) &&
                ((uVar7 = 0xc, uVar5 >> 0x20 != 0 && (uVar7 = 0xd, 0xffffffffff < uVar5)))) &&
               (uVar7 = 0xe, 0xffffffffffff < uVar5)) {
              uVar7 = 0xf;
              uVar9 = 0x100000000000000;
              goto LAB_0010a563;
            }
          }
          goto LAB_0010a3ab;
        }
        local_d8[uVar17] = 3;
        uVar7 = 9;
        if ((uVar5 < 0x100) || (uVar7 = 10, uVar5 < 0x10000)) goto LAB_0010a3ab;
      }
LAB_0010a3b0:
      if (uVar17 != 0) {
        local_70 = lVar11;
        local_68 = lVar15;
        trico_fill_code_double(&local_e0,local_58 + 2,local_58,local_d8);
        lVar11 = local_70;
        lVar15 = local_68;
      }
      lVar15 = lVar15 + 1;
    } while ((int)local_98 != (int)lVar15);
    puVar10 = local_c8;
    ppuVar12 = local_c0;
    if (uVar17 != 0) goto LAB_0010a6be;
  }
  ppuVar12 = local_c0;
  puVar10 = local_c8;
  local_d8[1] = 1;
  local_58[3] = 0;
  trico_fill_code_double(&local_e0,local_58 + 2,local_58,local_d8);
LAB_0010a6be:
  puVar6 = *ppuVar12;
  uVar16 = (int)local_e0 - (int)puVar6;
  *puVar10 = uVar16;
  free(local_a8);
  free(local_b0);
  puVar6 = (uint8_t *)realloc(puVar6,(ulong)uVar16);
  *ppuVar12 = puVar6;
  return;
}

Assistant:

void trico_compress_double_precision(uint32_t* nr_of_compressed_bytes, uint8_t** out, const double* input, const uint32_t number_of_doubles, uint64_t hash1_size_exponent, uint64_t hash2_size_exponent)
  {
  hash1_size_exponent = (hash1_size_exponent >> 1) << 1;
  hash2_size_exponent = (hash2_size_exponent >> 1) << 1;
  if (hash1_size_exponent > 30)
    hash1_size_exponent = 30;
  if (hash2_size_exponent > 30)
    hash2_size_exponent = 30;

  uint32_t max_size = (number_of_doubles) * sizeof(double) + (number_of_doubles) / 2 + (number_of_doubles & 1); // theoretical maximum
  *out = (uint8_t*)trico_malloc(max_size);

  const uint64_t hash1_size = (uint64_t)1 << hash1_size_exponent;
  const uint64_t hash2_size = (uint64_t)1 << hash2_size_exponent;
  const uint64_t hash1_mask = hash1_size - 1;
  const uint64_t hash2_mask = hash2_size - 1;

  uint64_t* hash_table_1 = (uint64_t*)trico_calloc(hash1_size, 8);
  uint64_t* hash_table_2 = (uint64_t*)trico_calloc(hash2_size, 8);

  uint64_t value;
  uint64_t stride;
  uint64_t last_value = 0;
  uint64_t hash1 = 0;
  uint64_t hash2 = 0;
  uint64_t prediction1 = 0;
  uint64_t prediction2 = 0;
  uint64_t xor1[2];
  uint64_t xor2[2];
  uint64_t bcode[2];
  uint32_t j = 0;
  uint8_t* p_out = *out;

  uint8_t hash_info = (uint8_t)(((hash1_size_exponent >> 1) << 4) | (hash2_size_exponent >> 1));
  *p_out++ = hash_info;

  *p_out++ = (uint8_t)((number_of_doubles >> 24));
  *p_out++ = (uint8_t)((number_of_doubles >> 16) & 0xff);
  *p_out++ = (uint8_t)((number_of_doubles >> 8) & 0xff);
  *p_out++ = (uint8_t)((number_of_doubles) & 0xff);

  for (uint32_t i = 0; i < number_of_doubles; ++i)
    {
    j = i & 1;
    value = *(const uint64_t*)(input++);

    xor1[j] = value ^ prediction1;
    hash_table_1[hash1] = value;
    hash1 = trico_compute_hash1_64(hash1, value, hash1_size_exponent, hash1_mask);
    prediction1 = hash_table_1[hash1];

    stride = value - last_value;
    xor2[j] = value ^ (last_value + prediction2);
    last_value = value;
    hash_table_2[hash2] = stride;
    hash2 = trico_compute_hash2_64(hash2, stride, hash2_size_exponent, hash2_mask);
    prediction2 = hash_table_2[hash2];


    bcode[j] = 8; // 8 bytes
    if (0 == xor1[j])
      {
      bcode[j] = 0; // 0 bytes
      }
    else if (0 == (xor1[j] >> 8))
      {
      bcode[j] = 1; // 1 byte
      }
    else if (0 == (xor1[j] >> 16))
      {
      bcode[j] = 2; // 2 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      }
    else if (0 == (xor1[j] >> 24))
      {
      bcode[j] = 3; // 3 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      }
    else if (0 == (xor1[j] >> 32))
      {
      bcode[j] = 4; // 4 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      }
    else if (0 == (xor1[j] >> 40))
      {
      bcode[j] = 5; // 5 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      }
    else if (0 == (xor1[j] >> 48))
      {
      bcode[j] = 6; // 6 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      else if (0 == (xor2[j] >> 40))
        {
        bcode[j] = 13; // 5 bytes
        }
      }
    else if (0 == (xor1[j] >> 56))
      {
      bcode[j] = 7; // 7 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      else if (0 == (xor2[j] >> 40))
        {
        bcode[j] = 13; // 5 bytes
        }
      else if (0 == (xor2[j] >> 48))
        {
        bcode[j] = 14; // 6 bytes
        }
      }
    else // 8 bytes
      {
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      else if (0 == (xor2[j] >> 40))
        {
        bcode[j] = 13; // 5 bytes
        }
      else if (0 == (xor2[j] >> 48))
        {
        bcode[j] = 14; // 6 bytes
        }
      else if (0 == (xor2[j] >> 56))
        {
        bcode[j] = 15; // 7 bytes
        }
      }

    if (j == 1)
      {
      trico_fill_code_double(&p_out, xor1, xor2, bcode);
      }
    }
  if (j == 0)
    {
    bcode[1] = 1;
    xor1[1] = 0;
    trico_fill_code_double(&p_out, xor1, xor2, bcode);
    }

  *nr_of_compressed_bytes = (uint32_t)(p_out - *out);
  trico_free(hash_table_1);
  trico_free(hash_table_2);
  *out = (uint8_t*)trico_realloc(*out, *nr_of_compressed_bytes);
  }